

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

fdb_compact_decision
cb_upt(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
      uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  ulong uVar7;
  fdb_kvs_handle *extraout_RDX;
  fdb_config *pfVar8;
  long extraout_RDX_00;
  char cVar9;
  char *pcVar10;
  fdb_config *fconfig;
  uint uVar11;
  ulong uVar12;
  fdb_doc *pfVar13;
  char *pcVar14;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *pfVar15;
  fdb_iterator *pfVar16;
  char *unaff_R12;
  fdb_kvs_handle *pfVar17;
  fdb_kvs_handle *pfVar18;
  long lVar19;
  fdb_kvs_handle *unaff_R13;
  fdb_custom_cmp_variable p_Var20;
  char *unaff_R15;
  fdb_doc **ppfVar21;
  char *pcVar22;
  fdb_kvs_info *info;
  undefined4 uVar23;
  undefined4 uVar24;
  void *v_out;
  size_t vlen_out;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  fdb_file_handle *pfStackY_1b80;
  timeval tStackY_1b78;
  fdb_config fStackY_1b68;
  code *pcStackY_1a70;
  fdb_kvs_handle *pfStackY_1a68;
  fdb_kvs_handle *pfStackY_1a60;
  ulong uStackY_1a58;
  fdb_kvs_handle *pfStackY_1a50;
  fdb_kvs_config fStackY_1a48;
  timeval tStackY_1a30;
  char *pcStackY_1a20;
  char *pcStackY_1a18;
  fdb_kvs_handle *pfStackY_1a10;
  char *pcStackY_1a08;
  char *pcStackY_1a00;
  code *pcStackY_19f8;
  fdb_file_handle *pfStackY_19e8;
  int iStackY_19dc;
  fdb_kvs_handle *pfStackY_19d8;
  fdb_kvs_handle *pfStackY_19d0;
  fdb_kvs_handle *pfStackY_19c8;
  fdb_kvs_handle *pfStackY_19c0;
  fdb_kvs_handle *pfStackY_19b8;
  undefined8 uStackY_19b0;
  undefined8 uStackY_19a8;
  undefined8 uStackY_19a0;
  timeval tStackY_1990;
  fdb_kvs_config fStackY_1980;
  fdb_config fStackY_1968;
  char acStackY_1870 [256];
  char acStackY_1770 [272];
  char *pcStackY_1660;
  fdb_kvs_handle *pfStackY_1658;
  char *pcStackY_1648;
  code *pcStackY_1640;
  fdb_snapshot_info_t *pfStackY_1630;
  fdb_kvs_handle *pfStackY_1628;
  uint64_t uStackY_1620;
  timeval tStackY_1618;
  size_t sStackY_1608;
  fdb_kvs_handle **ppfStackY_1600;
  code *pcStackY_15f8;
  fdb_kvs_handle *pfStackY_15f0;
  fdb_kvs_handle *pfStackY_15e8;
  fdb_kvs_handle *pfStackY_15e0;
  fdb_kvs_handle *pfStackY_15d8;
  undefined8 uStackY_15d0;
  undefined8 uStackY_15c8;
  fdb_kvs_handle *pfStackY_15c0;
  timeval tStackY_15b0;
  fdb_kvs_config fStackY_15a0;
  fdb_config fStackY_1588;
  char acStackY_1490 [256];
  fdb_kvs_handle *apfStackY_1390 [33];
  fdb_config *pfStackY_1288;
  fdb_kvs_handle *pfStackY_1280;
  fdb_kvs_handle *pfStackY_1278;
  char *pcStackY_1270;
  fdb_kvs_handle *pfStackY_1268;
  btree *pbStackY_1260;
  fdb_iterator *pfStack_1248;
  int iStack_123c;
  fdb_kvs_handle *pfStack_1238;
  fdb_file_handle *pfStack_1230;
  fdb_kvs_handle *pfStack_1228;
  char *pcStack_1220;
  int iStack_1218;
  undefined4 uStack_1214;
  fdb_snapshot_info_t *pfStack_1210;
  fdb_kvs_handle *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  long lStack_11f8;
  fdb_kvs_config fStack_11f0;
  char acStack_11d8 [256];
  timeval tStack_10d8;
  undefined1 auStack_10c8 [48];
  fdb_kvs_handle fStack_1098;
  fdb_kvs_handle *pfStack_e90;
  fdb_doc **ppfStack_e88;
  fdb_kvs_info *pfStack_e80;
  btree *pbStack_e78;
  fdb_kvs_handle *pfStack_e68;
  fdb_kvs_handle *pfStack_e60;
  fdb_file_handle *pfStack_e58;
  fdb_doc *pfStack_e50;
  fdb_iterator *pfStack_e48;
  fdb_snapshot_info_t *pfStack_e40;
  uint64_t uStack_e38;
  fdb_kvs_info fStack_e30;
  timeval tStack_e00;
  fdb_kvs_config fStack_df0;
  fdb_config fStack_dd8;
  fdb_doc *apfStack_ce0 [32];
  char *pcStack_be0;
  fdb_kvs_handle *pfStack_bd8;
  fdb_kvs_handle *pfStack_bd0;
  char *pcStack_bc8;
  fdb_kvs_handle *pfStack_bc0;
  fdb_kvs_handle *pfStack_bb0;
  fdb_file_handle *pfStack_ba8;
  fdb_snapshot_info_t *pfStack_ba0;
  uint64_t uStack_b98;
  undefined1 auStack_b90 [16];
  timeval tStack_b80;
  fdb_kvs_config fStack_b70;
  fdb_kvs_info fStack_b58;
  undefined1 auStack_b28 [292];
  undefined4 uStack_a04;
  char *pcStack_930;
  fdb_kvs_handle *pfStack_928;
  fdb_kvs_handle *pfStack_920;
  char *pcStack_918;
  char *pcStack_910;
  code *pcStack_908;
  fdb_file_handle *pfStack_900;
  uint64_t uStack_8f8;
  fdb_snapshot_info_t *pfStack_8f0;
  fdb_kvs_handle *pfStack_8e8;
  timeval tStack_8e0;
  fdb_kvs_config fStack_8d0;
  fdb_config fStack_8b8;
  char acStack_7c0 [256];
  fdb_kvs_handle *pfStack_6c0;
  fdb_kvs_handle *pfStack_6b8;
  fdb_kvs_handle *pfStack_6b0;
  fdb_kvs_handle *pfStack_6a8;
  code *pcStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_file_handle *pfStack_690;
  timeval tStack_688;
  char acStack_678 [256];
  fdb_doc *pfStack_578;
  fdb_kvs_handle *pfStack_570;
  fdb_kvs_handle *pfStack_568;
  fdb_doc **ppfStack_560;
  code *pcStack_558;
  fdb_kvs_handle *pfStack_548;
  fdb_kvs_handle *pfStack_540;
  fdb_doc *pfStack_538;
  char *pcStack_530;
  size_t sStack_528;
  fdb_kvs_handle *pfStack_520;
  timeval tStack_518;
  fdb_kvs_config fStack_508;
  undefined1 auStack_4f0 [360];
  undefined4 uStack_388;
  fdb_kvs_handle **ppfStack_380;
  fdb_kvs_handle *pfStack_2f0;
  fdb_kvs_handle *pfStack_2e8;
  fdb_encryption_key *pfStack_2e0;
  fdb_encryption_key *pfStack_2d8;
  fdb_kvs_handle *pfStack_2d0;
  fdb_encryption_key *local_2c0;
  fdb_kvs_handle *local_2b8;
  size_t local_2b0;
  void *local_2a8;
  size_t local_2a0;
  timeval local_298;
  fdb_doc local_288;
  fdb_kvs_handle local_238;
  
  pfStack_2d0 = (fdb_kvs_handle *)0x111a0d;
  gettimeofday(&local_298,(__timezone_ptr_t)0x0);
  if (status != 2) {
    return 0;
  }
  iVar2 = *(int *)((long)ctx + 0x24);
  uVar11 = iVar2 + 1;
  *(uint *)((long)ctx + 0x24) = uVar11;
  pfVar6 = (fdb_kvs_handle *)ctx;
  if (iVar2 < 5) {
LAB_00111d36:
    if ((short)((fdb_encryption_key *)kv_name)->algorithm == 0x6264) {
      return 0;
    }
    goto LAB_00111d70;
  }
  iVar2 = *(int *)((long)ctx + 0x20);
  local_2c0 = (fdb_encryption_key *)kv_name;
  if (iVar2 != 0) {
    if (10 < uVar11) {
      if (iVar2 == 1) goto LAB_00111be3;
      if (iVar2 == 2 && uVar11 == 0x11) goto LAB_00111c9d;
    }
    goto LAB_00111d36;
  }
  local_288.meta = (void *)0x0;
  local_288.body = (void *)0x0;
  local_288.seqnum = 0;
  local_288.offset = 0;
  local_288.size_ondisk = 0;
  local_288.metalen = 0;
  local_288.bodylen = 0;
  local_288.deleted = false;
  local_288._73_3_ = 0;
  local_288.flags = 0;
  local_288.key = doc->key;
  local_288.keylen = doc->keylen;
  pfStack_2d0 = (fdb_kvs_handle *)0x111a98;
  fVar1 = fdb_get(*(fdb_kvs_handle **)((long)ctx + 8),&local_288);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_2d0 = (fdb_kvs_handle *)0x111aaa;
    free(local_288.meta);
    pfStack_2d0 = (fdb_kvs_handle *)0x111ab7;
    free(local_288.body);
    doc = (fdb_doc *)0x1;
    unaff_R15 = (char *)&local_238.config.encryption_key;
    unaff_R12 = "new_body%04d";
    unaff_R13 = &local_238;
    kv_name = (char *)0x0;
    do {
      pfStack_2d0 = (fdb_kvs_handle *)0x111aea;
      sprintf(unaff_R15,"new%04d",kv_name);
      pfStack_2d0 = (fdb_kvs_handle *)0x111afa;
      sprintf((char *)unaff_R13,"new_body%04d",kv_name);
      local_2b8 = *(fdb_kvs_handle **)((long)ctx + 8);
      pfStack_2d0 = (fdb_kvs_handle *)0x111b0b;
      sVar3 = strlen(unaff_R15);
      local_2b0 = sVar3 + 1;
      pfStack_2d0 = (fdb_kvs_handle *)0x111b1b;
      sVar3 = strlen((char *)unaff_R13);
      pfStack_2d0 = (fdb_kvs_handle *)0x111b34;
      fVar1 = fdb_set_kv(local_2b8,unaff_R15,local_2b0,unaff_R13,sVar3 + 1);
      pfVar6 = (fdb_kvs_handle *)ctx;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00111d5c:
        pfStack_2d0 = (fdb_kvs_handle *)0x111d61;
        cb_upt();
        ctx = unaff_R15;
        goto LAB_00111d61;
      }
      pfStack_2d0 = (fdb_kvs_handle *)0x111b47;
      fVar1 = fdb_commit(*ctx,'\0');
      local_2b8 = (fdb_kvs_handle *)CONCAT44(local_2b8._4_4_,(int)doc);
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00111d57:
        pfStack_2d0 = (fdb_kvs_handle *)0x111d5c;
        cb_upt();
        goto LAB_00111d5c;
      }
      do {
        pfStack_2d0 = (fdb_kvs_handle *)0x111b67;
        sprintf(unaff_R15,"new%04d",kv_name);
        pfStack_2d0 = (fdb_kvs_handle *)0x111b77;
        sprintf((char *)unaff_R13,"new_body%04d",kv_name);
        pfVar6 = *(fdb_kvs_handle **)((long)ctx + 0x10);
        pfStack_2d0 = (fdb_kvs_handle *)0x111b83;
        sVar3 = strlen(unaff_R15);
        pfStack_2d0 = (fdb_kvs_handle *)0x111b9c;
        fVar1 = fdb_get_kv(pfVar6,unaff_R15,sVar3 + 1,&local_2a8,&local_2a0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pfStack_2d0 = (fdb_kvs_handle *)0x111d57;
          cb_upt();
          goto LAB_00111d57;
        }
        pfStack_2d0 = (fdb_kvs_handle *)0x111bae;
        fdb_free_block(local_2a8);
        uVar11 = (int)doc - 1;
        doc = (fdb_doc *)(ulong)uVar11;
      } while (uVar11 != 0);
      uVar11 = (int)kv_name + 1;
      kv_name = (char *)(ulong)uVar11;
      doc = (fdb_doc *)(ulong)((int)local_2b8 + 1);
    } while (uVar11 != 5);
    *(undefined4 *)((long)ctx + 0x20) = 1;
    pfVar6 = (fdb_kvs_handle *)ctx;
    kv_name = (char *)local_2c0;
    if (10 < *(int *)((long)ctx + 0x24)) {
LAB_00111be3:
      doc = (fdb_doc *)CONCAT71((int7)((ulong)doc >> 8),1);
      kv_name = (char *)&local_238.config.encryption_key;
      unaff_R12 = (char *)&local_238;
      pfVar6 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_2d0 = (fdb_kvs_handle *)0x111c0a;
        sprintf(kv_name,"xxx%d",pfVar6);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c1d;
        sprintf(unaff_R12,"xxxvalue%d",pfVar6);
        unaff_R13 = *(fdb_kvs_handle **)((long)ctx + 8);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c31;
        sVar3 = strlen(kv_name);
        pfVar6 = (fdb_kvs_handle *)(sVar3 + 1);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c3d;
        sVar3 = strlen(unaff_R12);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c52;
        fVar1 = fdb_set_kv(unaff_R13,kv_name,(size_t)pfVar6,unaff_R12,sVar3 + 1);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111d66;
        pfStack_2d0 = (fdb_kvs_handle *)0x111c64;
        fVar1 = fdb_commit(*ctx,'\0');
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111d61;
        pfVar6 = (fdb_kvs_handle *)0x1;
        cVar9 = (char)doc;
        doc = (fdb_doc *)0x0;
      } while (cVar9 != '\0');
      *(undefined4 *)((long)ctx + 0x20) = 2;
      kv_name = (char *)local_2c0;
      unaff_R15 = (char *)ctx;
      if (*(int *)((long)ctx + 0x24) == 0x11) {
LAB_00111c9d:
        doc = (fdb_doc *)CONCAT71((int7)((ulong)doc >> 8),1);
        kv_name = (char *)&local_238.config.encryption_key;
        unaff_R15 = "zzzvalue%d";
        unaff_R12 = (char *)&local_238;
        pfVar6 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_2d0 = (fdb_kvs_handle *)0x111ccb;
          sprintf(kv_name,"zzz%d",pfVar6);
          pfStack_2d0 = (fdb_kvs_handle *)0x111cda;
          sprintf(unaff_R12,"zzzvalue%d",pfVar6);
          unaff_R13 = *(fdb_kvs_handle **)((long)ctx + 8);
          pfStack_2d0 = (fdb_kvs_handle *)0x111cee;
          sVar3 = strlen(kv_name);
          pfVar6 = (fdb_kvs_handle *)(sVar3 + 1);
          pfStack_2d0 = (fdb_kvs_handle *)0x111cfa;
          sVar3 = strlen(unaff_R12);
          pfStack_2d0 = (fdb_kvs_handle *)0x111d0f;
          fVar1 = fdb_set_kv(unaff_R13,kv_name,(size_t)pfVar6,unaff_R12,sVar3 + 1);
          if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111d6b;
          pfVar6 = (fdb_kvs_handle *)0x1;
          cVar9 = (char)doc;
          doc = (fdb_doc *)0x0;
        } while (cVar9 != '\0');
        *(undefined4 *)((long)ctx + 0x20) = 3;
        kv_name = (char *)local_2c0;
      }
    }
    goto LAB_00111d36;
  }
  goto LAB_00111d78;
LAB_00111fdf:
  pcStack_558 = (code *)0x111fe4;
  compact_deleted_doc_test();
  goto LAB_00111fe4;
LAB_00112192:
  pcStack_6a0 = (code *)0x112197;
  compaction_del_cb();
  pfVar17 = pfVar18;
LAB_00112197:
  pfVar6 = (fdb_kvs_handle *)acStack_678;
  pcStack_6a0 = (code *)0x11219c;
  compaction_del_cb();
  goto LAB_0011219c;
LAB_0011271c:
  pfStack_bc0 = (fdb_kvs_handle *)0x112721;
  wal_delete_compact_upto_test();
LAB_00112721:
  pfStack_bc0 = (fdb_kvs_handle *)0x112726;
  wal_delete_compact_upto_test();
  goto LAB_00112726;
LAB_00112a8e:
  pbStack_e78 = (btree *)0x112a93;
  compact_upto_post_snapshot_test();
LAB_00112a93:
  pbStack_e78 = (btree *)0x112a98;
  compact_upto_post_snapshot_test();
LAB_00112a98:
  pbStack_e78 = (btree *)0x112a9d;
  compact_upto_post_snapshot_test();
  goto LAB_00112a9d;
LAB_00113134:
  pbStackY_1260 = (btree *)0x113139;
  compact_upto_overwrite_test();
LAB_00113139:
  pbStackY_1260 = (btree *)0x11313e;
  compact_upto_overwrite_test();
LAB_0011313e:
  pbStackY_1260 = (btree *)0x113143;
  compact_upto_overwrite_test();
LAB_00113143:
  pbStackY_1260 = (btree *)0x113153;
  compact_upto_overwrite_test();
LAB_00113153:
  pbStackY_1260 = (btree *)0x11315e;
  compact_upto_overwrite_test();
LAB_0011315e:
  pbStackY_1260 = (btree *)0x113163;
  compact_upto_overwrite_test();
LAB_00113163:
  pbStackY_1260 = (btree *)0x113168;
  compact_upto_overwrite_test();
LAB_00113168:
  pbStackY_1260 = (btree *)0x11316d;
  compact_upto_overwrite_test();
LAB_0011316d:
  pbStackY_1260 = (btree *)0x113172;
  compact_upto_overwrite_test();
LAB_00113172:
  pbStackY_1260 = (btree *)0x113177;
  compact_upto_overwrite_test();
LAB_00113177:
  pbStackY_1260 = (btree *)0x11317c;
  compact_upto_overwrite_test();
  goto LAB_0011317c;
LAB_00111d61:
  pfStack_2d0 = (fdb_kvs_handle *)0x111d66;
  cb_upt();
LAB_00111d66:
  pfStack_2d0 = (fdb_kvs_handle *)0x111d6b;
  cb_upt();
  unaff_R15 = (char *)ctx;
LAB_00111d6b:
  pfStack_2d0 = (fdb_kvs_handle *)0x111d70;
  cb_upt();
LAB_00111d70:
  pfStack_2d0 = (fdb_kvs_handle *)0x111d78;
  cb_upt();
  ctx = pfVar6;
LAB_00111d78:
  pfStack_2d0 = (fdb_kvs_handle *)compact_deleted_doc_test;
  cb_upt();
  pcStack_558 = (code *)0x111d98;
  pfStack_2f0 = (fdb_kvs_handle *)doc;
  pfStack_2e8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_2e0 = (fdb_encryption_key *)kv_name;
  pfStack_2d8 = (fdb_encryption_key *)unaff_R15;
  pfStack_2d0 = (fdb_kvs_handle *)ctx;
  gettimeofday(&tStack_518,(__timezone_ptr_t)0x0);
  pcStack_558 = (code *)0x111d9d;
  memleak_start();
  pcStack_558 = (code *)0x111da9;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_558 = (code *)0x111db9;
  fdb_get_default_config();
  pcStack_558 = (code *)0x111dc6;
  fdb_get_default_kvs_config();
  auStack_4f0[0x148] = 0;
  auStack_4f0._300_4_ = 1;
  auStack_4f0._352_8_ = compaction_del_cb;
  ppfStack_380 = &pfStack_520;
  uStack_388 = 0x10;
  pcStack_558 = (code *)0x111e03;
  fdb_open((fdb_file_handle **)&pfStack_548,"./compact_test1",(fdb_config *)(auStack_4f0 + 0x108));
  pcStack_558 = (code *)0x111e16;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_548,&pfStack_540,&fStack_508);
  pfStack_520 = pfStack_540;
  ppfVar21 = (fdb_doc **)0x14cf20;
  uVar7 = 0;
  do {
    pcStack_558 = (code *)0x111e41;
    sprintf((char *)auStack_4f0,"key%d",uVar7);
    pfVar17 = pfStack_540;
    pcStack_558 = (code *)0x111e4e;
    sVar3 = strlen((char *)auStack_4f0);
    pcStack_558 = (code *)0x111e65;
    pfVar13 = (fdb_doc *)auStack_4f0;
    pfVar6 = pfVar17;
    fVar1 = fdb_set_kv(pfVar17,(fdb_doc *)auStack_4f0,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_558 = (code *)0x111fdf;
      compact_deleted_doc_test();
      goto LAB_00111fdf;
    }
    uVar11 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar11;
  } while (uVar11 != 10);
  pcStack_558 = (code *)0x111e83;
  fdb_commit((fdb_file_handle *)pfStack_548,'\x01');
  pfVar13 = (fdb_doc *)0x14c131;
  pcStack_558 = (code *)0x111e94;
  pfVar6 = pfStack_548;
  fVar1 = fdb_compact((fdb_file_handle *)pfStack_548,"compact_test2");
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_558 = (code *)0x111ead;
    sVar4 = wal_get_num_flushable(*(filemgr **)(*(long *)&pfStack_548->kvs_config + 0x48));
    if (sVar4 != 0) {
      pcStack_558 = (code *)0x111ebc;
      compact_deleted_doc_test();
    }
    ppfVar21 = &pfStack_538;
    uVar7 = 0;
    do {
      pcStack_558 = (code *)0x111ede;
      sprintf(auStack_4f0,"key%d",uVar7);
      pcStack_558 = (code *)0x111ee6;
      sVar3 = strlen(auStack_4f0);
      pcStack_558 = (code *)0x111f04;
      fdb_doc_create(ppfVar21,auStack_4f0,sVar3,(void *)0x0,0,(void *)0x0,0);
      pcStack_558 = (code *)0x111f13;
      pfVar13 = pfStack_538;
      pfVar6 = pfStack_540;
      fVar1 = fdb_get_metaonly(pfStack_540,pfStack_538);
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00111fdf;
      pcStack_558 = (code *)0x111f26;
      fdb_doc_free(pfStack_538);
      uVar11 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar11;
    } while (uVar11 != 10);
    pcVar14 = auStack_4f0;
    pcStack_558 = (code *)0x111f48;
    sprintf(pcVar14,"key%d",10);
    pfVar18 = pfStack_540;
    pcStack_558 = (code *)0x111f55;
    sVar3 = strlen(pcVar14);
    pcStack_558 = (code *)0x111f6d;
    pfVar13 = (fdb_doc *)pcVar14;
    pfVar6 = pfVar18;
    fVar1 = fdb_get_kv(pfVar18,pcVar14,sVar3,&pcStack_530,&sStack_528);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_558 = (code *)0x111f7b;
      fdb_free_block(pcStack_530);
      pcStack_558 = (code *)0x111f85;
      fdb_kvs_close(pfStack_540);
      pcStack_558 = (code *)0x111f8f;
      fdb_close((fdb_file_handle *)pfStack_548);
      pcStack_558 = (code *)0x111f94;
      fdb_shutdown();
      pcStack_558 = (code *)0x111f99;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (compact_deleted_doc_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_558 = (code *)0x111fca;
      iVar2 = fprintf(_stderr,pcVar14,"compact deleted doc test");
      return iVar2;
    }
  }
  else {
LAB_00111fe4:
    pfVar18 = (fdb_kvs_handle *)auStack_4f0;
    pcVar14 = "key%d";
    pcStack_558 = (code *)0x111fe9;
    compact_deleted_doc_test();
  }
  pcStack_558 = compaction_del_cb;
  compact_deleted_doc_test();
  pfStack_570 = pfVar17;
  uVar12 = (ulong)pfVar13 & 0xffffffff;
  pcStack_6a0 = (code *)0x112019;
  pfStack_578 = (fdb_doc *)pcVar14;
  pfStack_568 = pfVar18;
  ppfStack_560 = ppfVar21;
  pcStack_558 = (code *)uVar7;
  gettimeofday(&tStack_688,(__timezone_ptr_t)0x0);
  pcVar14 = *(char **)&pfStack_548->kvs_config;
  pfVar17 = extraout_RDX;
  pfStack_698 = (fdb_kvs_handle *)pcVar14;
  if ((int)pfVar13 == 0x10) {
    if (extraout_RDX != (fdb_kvs_handle *)0x0) goto LAB_001121bf;
    if ((fdb_kvs_handle *)pcVar14 == (fdb_kvs_handle *)0x0) {
      return 0;
    }
    pcStack_6a0 = (code *)0x112054;
    fVar1 = fdb_open(&pfStack_690,"./compact_test1",
                     (fdb_config *)(*(long *)&pfVar6->kvs_config + 0x70));
    pfVar18 = extraout_RDX;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001121c4;
    pcStack_6a0 = (code *)0x11206c;
    fdb_kvs_open_default(pfStack_690,&pfStack_698,(fdb_kvs_config *)pcVar14);
    pcVar14 = "key%d";
    uVar12 = 0;
    do {
      pcStack_6a0 = (code *)0x112089;
      sprintf(acStack_678,"key%d",uVar12);
      pfVar18 = pfStack_698;
      pcStack_6a0 = (code *)0x112095;
      sVar3 = strlen(acStack_678);
      pcStack_6a0 = (code *)0x1120a3;
      fVar1 = fdb_del_kv(pfVar18,acStack_678,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStack_6a0 = (code *)0x112192;
        compaction_del_cb();
        goto LAB_00112192;
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != 10);
    pcVar14 = "KEY%d";
    uVar12 = 0;
    do {
      pcStack_6a0 = (code *)0x1120cf;
      sprintf(acStack_678,"KEY%d",uVar12);
      pfVar17 = pfStack_698;
      pcStack_6a0 = (code *)0x1120db;
      sVar3 = strlen(acStack_678);
      pcStack_6a0 = (code *)0x1120ee;
      fVar1 = fdb_set_kv(pfVar17,acStack_678,sVar3,(void *)0x0,0);
      pfVar18 = pfStack_698;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112197;
      pcStack_6a0 = (code *)0x112102;
      sVar3 = strlen(acStack_678);
      pcStack_6a0 = (code *)0x112110;
      fVar1 = fdb_del_kv(pfVar18,acStack_678,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112192;
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != 10);
    pcVar14 = acStack_678;
    pcStack_6a0 = (code *)0x112136;
    sprintf(pcVar14,"key%d",10);
    pfVar6 = pfStack_698;
    pcStack_6a0 = (code *)0x112142;
    sVar3 = strlen(pcVar14);
    pcStack_6a0 = (code *)0x112155;
    fVar1 = fdb_set_kv(pfVar6,pcVar14,sVar3,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001121c9;
    pcStack_6a0 = (code *)0x112165;
    fVar1 = fdb_commit(pfStack_690,'\0');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_6a0 = (code *)0x112173;
      fdb_close(pfStack_690);
      *(undefined8 *)&pfStack_548->kvs_config = 0;
      return 0;
    }
  }
  else {
LAB_0011219c:
    iVar2 = (int)uVar12;
    if (iVar2 == 8) {
LAB_001121b5:
      pcStack_6a0 = (code *)0x1121ba;
      compaction_del_cb();
    }
    else {
      if (iVar2 == 2) {
LAB_001121b0:
        pcStack_6a0 = (code *)0x1121b5;
        compaction_del_cb();
        goto LAB_001121b5;
      }
      if (iVar2 == 1) {
        pcStack_6a0 = (code *)0x1121b0;
        compaction_del_cb();
        goto LAB_001121b0;
      }
    }
    pcStack_6a0 = (code *)0x1121bf;
    compaction_del_cb();
LAB_001121bf:
    pcStack_6a0 = (code *)0x1121c4;
    compaction_del_cb();
    pfVar18 = pfVar17;
LAB_001121c4:
    pcStack_6a0 = (code *)0x1121c9;
    compaction_del_cb();
LAB_001121c9:
    pcStack_6a0 = (code *)0x1121ce;
    compaction_del_cb();
  }
  pcStack_6a0 = compact_upto_twice_test;
  compaction_del_cb();
  pfStack_6b8 = pfStack_548;
  pcStack_908 = (code *)0x1121ee;
  pfStack_6c0 = (fdb_kvs_handle *)pcVar14;
  pfStack_6b0 = pfVar6;
  pfStack_6a8 = pfVar18;
  pcStack_6a0 = (code *)uVar12;
  gettimeofday(&tStack_8e0,(__timezone_ptr_t)0x0);
  pcStack_908 = (code *)0x1121f3;
  memleak_start();
  pcStack_908 = (code *)0x1121ff;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_908 = (code *)0x11220c;
  fdb_get_default_config();
  pcStack_908 = (code *)0x112219;
  fdb_get_default_kvs_config();
  fStack_8b8.wal_threshold = 0x400;
  fStack_8b8.flags = 1;
  fStack_8b8.block_reusing_threshold = 0;
  pcStack_908 = (code *)0x112248;
  fdb_open(&pfStack_900,"./compact_test1",&fStack_8b8);
  pcStack_908 = (code *)0x112258;
  fdb_kvs_open_default(pfStack_900,&pfStack_8e8,&fStack_8d0);
  uVar7 = 0;
  do {
    pcStack_908 = (code *)0x11227f;
    sprintf(acStack_7c0,"key%d",uVar7);
    pfVar6 = pfStack_8e8;
    pcStack_908 = (code *)0x11228c;
    sVar3 = strlen(acStack_7c0);
    pcStack_908 = (code *)0x1122a3;
    fVar1 = fdb_set_kv(pfVar6,acStack_7c0,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_908 = (code *)0x1123c5;
      compact_upto_twice_test();
      goto LAB_001123c5;
    }
    pcStack_908 = (code *)0x1122b9;
    fdb_commit(pfStack_900,'\x01');
    uVar11 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar11;
  } while (uVar11 != 10);
  pcStack_908 = (code *)0x1122d3;
  fVar1 = fdb_get_all_snap_markers(pfStack_900,&pfStack_8f0,&uStack_8f8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_908 = (code *)0x1122f9;
    fVar1 = fdb_compact_upto(pfStack_900,(char *)0x0,pfStack_8f0[uStack_8f8 - 1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123ca;
    pcStack_908 = (code *)0x112310;
    fVar1 = fdb_free_snap_markers(pfStack_8f0,uStack_8f8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123cf;
    pcStack_908 = (code *)0x11232b;
    fVar1 = fdb_get_all_snap_markers(pfStack_900,&pfStack_8f0,&uStack_8f8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123d4;
    pcStack_908 = (code *)0x112351;
    fVar1 = fdb_compact_upto(pfStack_900,(char *)0x0,pfStack_8f0[uStack_8f8 - 2].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001123d9;
    pcStack_908 = (code *)0x112368;
    fVar1 = fdb_free_snap_markers(pfStack_8f0,uStack_8f8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_908 = (code *)0x112375;
      fdb_close(pfStack_900);
      pcStack_908 = (code *)0x11237a;
      fdb_shutdown();
      pcStack_908 = (code *)0x11237f;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (compact_upto_twice_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_908 = (code *)0x1123b0;
      iVar2 = fprintf(_stderr,pcVar14,"compact upto twice");
      return iVar2;
    }
  }
  else {
LAB_001123c5:
    pcStack_908 = (code *)0x1123ca;
    compact_upto_twice_test();
LAB_001123ca:
    pcStack_908 = (code *)0x1123cf;
    compact_upto_twice_test();
LAB_001123cf:
    pcStack_908 = (code *)0x1123d4;
    compact_upto_twice_test();
LAB_001123d4:
    pcStack_908 = (code *)0x1123d9;
    compact_upto_twice_test();
LAB_001123d9:
    pcStack_908 = (code *)0x1123de;
    compact_upto_twice_test();
  }
  pcStack_908 = wal_delete_compact_upto_test;
  compact_upto_twice_test();
  pcStack_910 = "value";
  pfStack_928 = pfVar6;
  pcStack_930 = "key%d";
  pfStack_bc0 = (fdb_kvs_handle *)0x112400;
  pfStack_920 = unaff_R13;
  pcStack_918 = acStack_7c0;
  pcStack_908 = (code *)uVar7;
  gettimeofday(&tStack_b80,(__timezone_ptr_t)0x0);
  pfStack_bc0 = (fdb_kvs_handle *)0x112405;
  memleak_start();
  pfStack_bc0 = (fdb_kvs_handle *)0x112411;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_bc0 = (fdb_kvs_handle *)0x112421;
  fdb_get_default_config();
  pfStack_bc0 = (fdb_kvs_handle *)0x11242e;
  fdb_get_default_kvs_config();
  auStack_b28._272_8_ = (void *)0x13;
  uStack_a04 = 1;
  pfStack_bc0 = (fdb_kvs_handle *)0x112454;
  fdb_open(&pfStack_ba8,"./compact_test5",(fdb_config *)(auStack_b28 + 0x100));
  pfStack_bc0 = (fdb_kvs_handle *)0x112464;
  fdb_kvs_open_default(pfStack_ba8,&pfStack_bb0,&fStack_b70);
  pcVar10 = "key%d";
  pcVar14 = auStack_b28;
  pcVar22 = "value";
  pfVar6 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_bc0 = (fdb_kvs_handle *)0x11248b;
    sprintf(pcVar14,"key%d",pfVar6);
    pfVar17 = pfStack_bb0;
    pfStack_bc0 = (fdb_kvs_handle *)0x112498;
    sVar3 = strlen(pcVar14);
    pfStack_bc0 = (fdb_kvs_handle *)0x1124af;
    fVar1 = fdb_set_kv(pfVar17,pcVar14,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_bc0 = (fdb_kvs_handle *)0x11271c;
      wal_delete_compact_upto_test();
      goto LAB_0011271c;
    }
    uVar11 = (int)pfVar6 + 1;
    pfVar6 = (fdb_kvs_handle *)(ulong)uVar11;
  } while (uVar11 != 10);
  pfStack_bc0 = (fdb_kvs_handle *)0x1124cd;
  fVar1 = fdb_commit(pfStack_ba8,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar10 = (char *)0xa;
    pcVar14 = "key%d";
    pcVar22 = auStack_b28;
    pfVar17 = (fdb_kvs_handle *)0x14cf20;
    do {
      pfStack_bc0 = (fdb_kvs_handle *)0x1124ff;
      sprintf(pcVar22,"key%d",pcVar10);
      unaff_R13 = pfStack_bb0;
      pfStack_bc0 = (fdb_kvs_handle *)0x11250c;
      sVar3 = strlen(pcVar22);
      pfStack_bc0 = (fdb_kvs_handle *)0x112523;
      fVar1 = fdb_set_kv(unaff_R13,pcVar22,sVar3,"value",5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011271c;
      uVar11 = (int)pcVar10 + 1;
      pcVar10 = (char *)(ulong)uVar11;
    } while (uVar11 != 0x14);
    pcVar10 = (char *)0xf;
    pcVar14 = "key%d";
    pcVar22 = auStack_b28;
    do {
      pfStack_bc0 = (fdb_kvs_handle *)0x112555;
      sprintf(pcVar22,"key%d",pcVar10);
      pfVar17 = pfStack_bb0;
      pfStack_bc0 = (fdb_kvs_handle *)0x112562;
      sVar3 = strlen(pcVar22);
      pfStack_bc0 = (fdb_kvs_handle *)0x112570;
      fVar1 = fdb_del_kv(pfVar17,pcVar22,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112721;
      uVar11 = (int)pcVar10 + 1;
      pcVar10 = (char *)(ulong)uVar11;
    } while (uVar11 != 0x14);
    pfStack_bc0 = (fdb_kvs_handle *)0x11258b;
    fVar1 = fdb_commit(pfStack_ba8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112730;
    pcVar10 = auStack_b28;
    pfStack_bc0 = (fdb_kvs_handle *)0x1125b1;
    sprintf(pcVar10,"key%d",0x14);
    pcVar14 = (char *)pfStack_bb0;
    pfStack_bc0 = (fdb_kvs_handle *)0x1125be;
    sVar3 = strlen(pcVar10);
    pfStack_bc0 = (fdb_kvs_handle *)0x1125d9;
    fVar1 = fdb_set_kv((fdb_kvs_handle *)pcVar14,pcVar10,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112735;
    pfStack_bc0 = (fdb_kvs_handle *)0x1125ed;
    fVar1 = fdb_commit(pfStack_ba8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011273a;
    pfStack_bc0 = (fdb_kvs_handle *)0x112609;
    fVar1 = fdb_get_all_snap_markers(pfStack_ba8,&pfStack_ba0,&uStack_b98);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011273f;
    pfStack_bc0 = (fdb_kvs_handle *)0x112626;
    fVar1 = fdb_compact_upto(pfStack_ba8,(char *)0x0,pfStack_ba0[1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112744;
    pfStack_bc0 = (fdb_kvs_handle *)0x11263d;
    fVar1 = fdb_free_snap_markers(pfStack_ba0,uStack_b98);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112749;
    pfStack_bc0 = (fdb_kvs_handle *)0x112654;
    fVar1 = fdb_get_kvs_info(pfStack_bb0,&fStack_b58);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar10 = (char *)0xf;
      pcVar14 = "key%d";
      pcVar22 = auStack_b28;
      pfVar17 = (fdb_kvs_handle *)(auStack_b90 + 8);
      unaff_R13 = (fdb_kvs_handle *)auStack_b90;
      while( true ) {
        pfStack_bc0 = (fdb_kvs_handle *)0x112689;
        sprintf(pcVar22,"key%d",pcVar10);
        pfVar6 = pfStack_bb0;
        pfStack_bc0 = (fdb_kvs_handle *)0x112696;
        sVar3 = strlen(pcVar22);
        pfStack_bc0 = (fdb_kvs_handle *)0x1126aa;
        fVar1 = fdb_get_kv(pfVar6,pcVar22,sVar3,(void **)pfVar17,(size_t *)unaff_R13);
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) break;
        uVar11 = (int)pcVar10 + 1;
        pcVar10 = (char *)(ulong)uVar11;
        if (uVar11 == 0x14) {
          pfStack_bc0 = (fdb_kvs_handle *)0x1126c0;
          fdb_kvs_close(pfStack_bb0);
          pfStack_bc0 = (fdb_kvs_handle *)0x1126ca;
          fdb_close(pfStack_ba8);
          pfStack_bc0 = (fdb_kvs_handle *)0x1126cf;
          fdb_shutdown();
          pfStack_bc0 = (fdb_kvs_handle *)0x1126d4;
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (wal_delete_compact_upto_test()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pfStack_bc0 = (fdb_kvs_handle *)0x112705;
          iVar2 = fprintf(_stderr,pcVar14,"compact upto with wal deletes test");
          return iVar2;
        }
      }
LAB_00112726:
      pfStack_bc0 = (fdb_kvs_handle *)0x11272b;
      wal_delete_compact_upto_test();
      goto LAB_0011272b;
    }
  }
  else {
LAB_0011272b:
    pfStack_bc0 = (fdb_kvs_handle *)0x112730;
    wal_delete_compact_upto_test();
LAB_00112730:
    pfStack_bc0 = (fdb_kvs_handle *)0x112735;
    wal_delete_compact_upto_test();
LAB_00112735:
    pfStack_bc0 = (fdb_kvs_handle *)0x11273a;
    wal_delete_compact_upto_test();
LAB_0011273a:
    pfStack_bc0 = (fdb_kvs_handle *)0x11273f;
    wal_delete_compact_upto_test();
LAB_0011273f:
    pfStack_bc0 = (fdb_kvs_handle *)0x112744;
    wal_delete_compact_upto_test();
LAB_00112744:
    pfStack_bc0 = (fdb_kvs_handle *)0x112749;
    wal_delete_compact_upto_test();
LAB_00112749:
    pfStack_bc0 = (fdb_kvs_handle *)0x11274e;
    wal_delete_compact_upto_test();
  }
  pfStack_bc0 = (fdb_kvs_handle *)compact_upto_post_snapshot_test;
  wal_delete_compact_upto_test();
  pbStack_e78 = (btree *)0x112771;
  pcStack_be0 = pcVar10;
  pfStack_bd8 = pfVar17;
  pfStack_bd0 = (fdb_kvs_handle *)pcVar14;
  pcStack_bc8 = pcVar22;
  pfStack_bc0 = pfVar6;
  gettimeofday(&tStack_e00,(__timezone_ptr_t)0x0);
  pbStack_e78 = (btree *)0x112776;
  memleak_start();
  pfStack_e50 = (fdb_doc *)0x0;
  pbStack_e78 = (btree *)0x112787;
  system("rm -rf  compact_test* > errorlog.txt");
  pbStack_e78 = (btree *)0x112797;
  fdb_get_default_config();
  pbStack_e78 = (btree *)0x1127a7;
  fdb_get_default_kvs_config();
  fStack_dd8.wal_threshold = 0x400;
  fStack_dd8.flags = 1;
  fStack_dd8.block_reusing_threshold = 0;
  pbStack_e78 = (btree *)0x1127d4;
  fdb_open(&pfStack_e58,"./compact_test1",&fStack_dd8);
  pbStack_e78 = (btree *)0x1127e4;
  fdb_kvs_open_default(pfStack_e58,&pfStack_e60,&fStack_df0);
  pcVar14 = "key%d";
  ppfVar21 = apfStack_ce0;
  info = (fdb_kvs_info *)0x14cf20;
  pcVar10 = (char *)0x0;
  do {
    pbStack_e78 = (btree *)0x11280b;
    sprintf((char *)ppfVar21,"key%d",pcVar10);
    pfVar6 = pfStack_e60;
    pbStack_e78 = (btree *)0x112818;
    sVar3 = strlen((char *)ppfVar21);
    pbStack_e78 = (btree *)0x11282f;
    pfVar17 = pfVar6;
    fVar1 = fdb_set_kv(pfVar6,ppfVar21,sVar3,"value",5);
    iVar2 = (int)pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pbStack_e78 = (btree *)0x112a8e;
      compact_upto_post_snapshot_test();
      goto LAB_00112a8e;
    }
    pbStack_e78 = (btree *)0x112846;
    fdb_commit(pfStack_e58,'\x01');
    uVar11 = (int)pcVar10 + 1;
    pcVar10 = (char *)(ulong)uVar11;
  } while (uVar11 != 10);
  pbStack_e78 = (btree *)0x11285c;
  pfVar17 = pfStack_e60;
  fVar1 = fdb_get_kvs_info(pfStack_e60,&fStack_e30);
  iVar2 = (int)pfVar17;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar14 = (char *)&fStack_e30.last_seqnum;
    if (fStack_e30.last_seqnum != 10) {
      pbStack_e78 = (btree *)0x112877;
      compact_upto_post_snapshot_test();
    }
    pbStack_e78 = (btree *)0x11288b;
    pfVar17 = pfStack_e60;
    fVar1 = fdb_snapshot_open(pfStack_e60,&pfStack_e68,5);
    iVar2 = (int)pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa2;
    pbStack_e78 = (btree *)0x1128a2;
    pfVar17 = pfStack_e68;
    fVar1 = fdb_get_kvs_info(pfStack_e68,&fStack_e30);
    iVar2 = (int)pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa7;
    if (fStack_e30.last_seqnum != 5) {
      pbStack_e78 = (btree *)0x1128ba;
      compact_upto_post_snapshot_test();
    }
    pbStack_e78 = (btree *)0x1128ce;
    pfVar15 = pfStack_e58;
    fVar1 = fdb_get_all_snap_markers(pfStack_e58,&pfStack_e40,&uStack_e38);
    iVar2 = (int)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aac;
    pbStack_e78 = (btree *)0x1128eb;
    pfVar15 = pfStack_e58;
    fVar1 = fdb_compact_upto(pfStack_e58,(char *)0x0,pfStack_e40[5].marker);
    iVar2 = (int)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab1;
    pbStack_e78 = (btree *)0x112902;
    fVar1 = fdb_free_snap_markers(pfStack_e40,uStack_e38);
    iVar2 = (int)pfStack_e40;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab6;
    pbStack_e78 = (btree *)0x112919;
    pfVar17 = pfStack_e60;
    fVar1 = fdb_get_kvs_info(pfStack_e60,&fStack_e30);
    iVar2 = (int)pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112abb;
    if (fStack_e30.last_seqnum != 10) {
      pbStack_e78 = (btree *)0x112931;
      compact_upto_post_snapshot_test();
    }
    pbStack_e78 = (btree *)0x112940;
    pfVar17 = pfStack_e68;
    fVar1 = fdb_get_kvs_info(pfStack_e68,&fStack_e30);
    iVar2 = (int)pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac0;
    if (fStack_e30.last_seqnum != 5) {
      pbStack_e78 = (btree *)0x112958;
      compact_upto_post_snapshot_test();
    }
    pbStack_e78 = (btree *)0x112978;
    pfVar17 = pfStack_e68;
    fVar1 = fdb_iterator_init(pfStack_e68,&pfStack_e48,(void *)0x0,0,(void *)0x0,0,0);
    iVar2 = (int)pfVar17;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac5;
    pcVar10 = (char *)0x5;
    ppfVar21 = &pfStack_e50;
    info = &fStack_e30;
    do {
      pbStack_e78 = (btree *)0x11299c;
      pfVar16 = pfStack_e48;
      fVar1 = fdb_iterator_get(pfStack_e48,ppfVar21);
      iVar2 = (int)pfVar16;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a8e;
      pbStack_e78 = (btree *)0x1129ae;
      fdb_doc_free(pfStack_e50);
      pfStack_e50 = (fdb_doc *)0x0;
      pbStack_e78 = (btree *)0x1129c4;
      pfVar17 = pfStack_e60;
      fVar1 = fdb_get_kvs_info(pfStack_e60,info);
      iVar2 = (int)pfVar17;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a93;
      if (fStack_e30.last_seqnum != 10) {
        pbStack_e78 = (btree *)0x112a0c;
        compact_upto_post_snapshot_test();
      }
      pbStack_e78 = (btree *)0x1129e1;
      pfVar17 = pfStack_e68;
      fVar1 = fdb_get_kvs_info(pfStack_e68,info);
      iVar2 = (int)pfVar17;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a98;
      if (fStack_e30.last_seqnum != 5) {
        pbStack_e78 = (btree *)0x112a16;
        compact_upto_post_snapshot_test();
      }
      pbStack_e78 = (btree *)0x1129fb;
      pfVar16 = pfStack_e48;
      fVar1 = fdb_iterator_next(pfStack_e48);
      iVar2 = (int)pfVar16;
      uVar11 = (int)pcVar10 - 1;
      pcVar10 = (char *)(ulong)uVar11;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar11 == 0) {
      pbStack_e78 = (btree *)0x112a2a;
      fdb_iterator_close(pfStack_e48);
      pbStack_e78 = (btree *)0x112a34;
      fdb_kvs_close(pfStack_e68);
      pbStack_e78 = (btree *)0x112a3e;
      fdb_close(pfStack_e58);
      pbStack_e78 = (btree *)0x112a43;
      fdb_shutdown();
      pbStack_e78 = (btree *)0x112a48;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pbStack_e78 = (btree *)0x112a79;
      iVar2 = fprintf(_stderr,pcVar14,"compact upto post snapshot test");
      return iVar2;
    }
  }
  else {
LAB_00112a9d:
    pbStack_e78 = (btree *)0x112aa2;
    compact_upto_post_snapshot_test();
LAB_00112aa2:
    pbStack_e78 = (btree *)0x112aa7;
    compact_upto_post_snapshot_test();
LAB_00112aa7:
    pbStack_e78 = (btree *)0x112aac;
    compact_upto_post_snapshot_test();
LAB_00112aac:
    pbStack_e78 = (btree *)0x112ab1;
    compact_upto_post_snapshot_test();
LAB_00112ab1:
    pbStack_e78 = (btree *)0x112ab6;
    compact_upto_post_snapshot_test();
LAB_00112ab6:
    pbStack_e78 = (btree *)0x112abb;
    compact_upto_post_snapshot_test();
LAB_00112abb:
    pbStack_e78 = (btree *)0x112ac0;
    compact_upto_post_snapshot_test();
LAB_00112ac0:
    pbStack_e78 = (btree *)0x112ac5;
    compact_upto_post_snapshot_test();
LAB_00112ac5:
    pbStack_e78 = (btree *)0x112aca;
    compact_upto_post_snapshot_test();
  }
  pbStack_e78 = (btree *)compact_upto_overwrite_test;
  compact_upto_post_snapshot_test();
  fStack_1098.bub_ctx.handle = pfVar6;
  pfVar17 = (fdb_kvs_handle *)0x0;
  pbStackY_1260 = (btree *)0x112af6;
  iStack_123c = iVar2;
  fStack_1098.bub_ctx.space_used = (uint64_t)pcVar14;
  pfStack_e90 = unaff_R13;
  ppfStack_e88 = ppfVar21;
  pfStack_e80 = info;
  pbStack_e78 = (btree *)pcVar10;
  gettimeofday(&tStack_10d8,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_11d8,"rm -rf  compact_test* > errorlog.txt",0x25);
  pbStackY_1260 = (btree *)0x112b26;
  system(acStack_11d8);
  pbStackY_1260 = (btree *)0x112b2b;
  memleak_start();
  pbStackY_1260 = (btree *)0x112b35;
  pcVar14 = (char *)malloc(0x20);
  fconfig = (fdb_config *)(auStack_10c8 + 0x130);
  pbStackY_1260 = (btree *)0x112b48;
  fdb_get_default_config();
  fStack_1098.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_1098.config.encryption_key.bytes[0x1d] = '\x02';
  fStack_1098.config.encryption_key.bytes[0x14] = 1;
  fStack_1098.config.num_keeping_headers._0_1_ = 1;
  fStack_1098.config.encryption_key.bytes[4] = '\0';
  fStack_1098.config.encryption_key.bytes[5] = '\0';
  fStack_1098.config.encryption_key.bytes[6] = '\0';
  fStack_1098.config.encryption_key.bytes[7] = '\0';
  fStack_1098.config.encryption_key.bytes[8] = '\0';
  fStack_1098.config.encryption_key.bytes[9] = '\0';
  fStack_1098.config.encryption_key.bytes[10] = '\0';
  fStack_1098.config.encryption_key.bytes[0xb] = '\0';
  fStack_1098.max_seqnum = 0;
  pbStackY_1260 = (btree *)0x112b6b;
  fdb_get_default_kvs_config();
  pbStackY_1260 = (btree *)0x112b7f;
  fVar1 = fdb_open(&pfStack_1230,"./compact_test",fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011317c:
    pbStackY_1260 = (btree *)0x113181;
    compact_upto_overwrite_test();
LAB_00113181:
    pbStackY_1260 = (btree *)0x113186;
    compact_upto_overwrite_test();
LAB_00113186:
    pbStackY_1260 = (btree *)0x11318b;
    compact_upto_overwrite_test();
LAB_0011318b:
    pbStackY_1260 = (btree *)0x113190;
    compact_upto_overwrite_test();
LAB_00113190:
    pbStackY_1260 = (btree *)0x113195;
    compact_upto_overwrite_test();
LAB_00113195:
    pbStackY_1260 = (btree *)0x11319a;
    compact_upto_overwrite_test();
LAB_0011319a:
    pbStackY_1260 = (btree *)0x11319f;
    compact_upto_overwrite_test();
LAB_0011319f:
    pbStackY_1260 = (btree *)0x1131a4;
    compact_upto_overwrite_test();
LAB_001131a4:
    pbStackY_1260 = (btree *)0x1131a9;
    compact_upto_overwrite_test();
LAB_001131a9:
    pbStackY_1260 = (btree *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_15f8 = (code *)0x1131cb;
    pfStackY_1288 = fconfig;
    pfStackY_1280 = pfVar6;
    pfStackY_1278 = unaff_R13;
    pcStackY_1270 = pcVar14;
    pfStackY_1268 = pfVar17;
    pbStackY_1260 = (btree *)pcVar10;
    gettimeofday(&tStackY_15b0,(__timezone_ptr_t)0x0);
    pcStackY_15f8 = (code *)0x1131d0;
    memleak_start();
    pcStackY_15f8 = (code *)0x1131dd;
    fdb_get_default_config();
    pcStackY_15f8 = (code *)0x1131ea;
    fdb_get_default_kvs_config();
    fStackY_1588.compaction_cb_ctx = &uStackY_15d0;
    uStackY_15d0 = 0;
    uStackY_15c8 = 0;
    pfStackY_15c0 = (fdb_kvs_handle *)0x0;
    fStackY_1588.wal_threshold = 0x400;
    fStackY_1588.flags = 1;
    fStackY_1588.compaction_cb = compaction_cb_get;
    fStackY_1588.compaction_cb_mask = 0x1b;
    pcStackY_15f8 = (code *)0x113230;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_15f8 = (code *)0x113245;
    fdb_open((fdb_file_handle **)&pfStackY_15f0,"./compact_test1",&fStackY_1588);
    pcStackY_15f8 = (code *)0x11325f;
    fdb_kvs_open((fdb_file_handle *)pfStackY_15f0,&pfStackY_15d8,"db",&fStackY_15a0);
    pcStackY_15f8 = (code *)0x113272;
    fdb_kvs_open((fdb_file_handle *)pfStackY_15f0,&pfStackY_15e8,"db",&fStackY_15a0);
    uVar7 = 0;
    do {
      pcStackY_15f8 = (code *)0x11329e;
      sprintf((char *)apfStackY_1390,"key%04d",uVar7);
      pcStackY_15f8 = (code *)0x1132ad;
      sprintf(acStackY_1490,"body%04d",uVar7);
      pfVar6 = pfStackY_15d8;
      pcStackY_15f8 = (code *)0x1132ba;
      sVar3 = strlen((char *)apfStackY_1390);
      pcStackY_15f8 = (code *)0x1132c5;
      sVar5 = strlen(acStackY_1490);
      pcStackY_15f8 = (code *)0x1132d9;
      ptr_handle = apfStackY_1390;
      pfVar17 = pfVar6;
      fVar1 = fdb_set_kv(pfVar6,apfStackY_1390,sVar3,acStackY_1490,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_15f8 = (code *)0x11339e;
        compact_with_snapshot_open_test();
        goto LAB_0011339e;
      }
      uVar11 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar11;
    } while (uVar11 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_15f8 = (code *)0x1132f9;
    pfVar17 = pfStackY_15f0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_15f0,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_15c0 = pfStackY_15e8;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_15f8 = (code *)0x113316;
      pfVar17 = pfStackY_15f0;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_15f0,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a3;
      ptr_handle = &pfStackY_15e0;
      pcStackY_15f8 = (code *)0x113332;
      pfVar17 = pfStackY_15e8;
      fVar1 = fdb_snapshot_open(pfStackY_15e8,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a8;
      pcStackY_15f8 = (code *)0x113340;
      fdb_kvs_close(pfStackY_15e0);
      pcStackY_15f8 = (code *)0x113349;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_15f0);
      pfVar17 = pfStackY_15f0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133ad;
      pcStackY_15f8 = (code *)0x113352;
      fVar1 = fdb_shutdown();
      pfVar17 = pfStackY_15f0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar14 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pcStackY_15f8 = (code *)0x113387;
        iVar2 = fprintf(_stderr,pcVar14,"compact with snapshot_open test");
        return iVar2;
      }
    }
    else {
LAB_0011339e:
      pcStackY_15f8 = (code *)0x1133a3;
      compact_with_snapshot_open_test();
LAB_001133a3:
      pcStackY_15f8 = (code *)0x1133a8;
      compact_with_snapshot_open_test();
LAB_001133a8:
      pcStackY_15f8 = (code *)0x1133ad;
      compact_with_snapshot_open_test();
LAB_001133ad:
      pcStackY_15f8 = (code *)0x1133b2;
      compact_with_snapshot_open_test();
    }
    pcStackY_15f8 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_1640 = (code *)0x1133d3;
    sStackY_1608 = sVar3;
    ppfStackY_1600 = apfStackY_1390;
    pcStackY_15f8 = (code *)uVar7;
    gettimeofday(&tStackY_1618,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX_00 == 0) {
        pcStackY_1640 = (code *)0x1133e2;
        compaction_cb_get();
        goto LAB_001133e2;
      }
    }
    else {
LAB_001133e2:
      if (extraout_RDX_00 != 0) goto LAB_00113449;
    }
    pcStackY_1640 = (code *)0x1133f9;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar17,&pfStackY_1630,&uStackY_1620);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_1640 = (code *)0x11341d;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_15e8->kvs_config).custom_cmp_param,
                                &pfStackY_1628,pfStackY_1630->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011343f;
      pcStackY_1640 = (code *)0x11342b;
      fVar1 = fdb_kvs_close(pfStackY_1628);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return 0;
      }
    }
    else {
      pcStackY_1640 = (code *)0x11343f;
      compaction_cb_get();
LAB_0011343f:
      pcStackY_1640 = (code *)0x113444;
      compaction_cb_get();
    }
    pcStackY_1640 = (code *)0x113449;
    compaction_cb_get();
LAB_00113449:
    pcStackY_1640 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_1648 = "body%04d";
    pfStackY_1658 = pfVar6;
    pcStackY_19f8 = (code *)0x11346b;
    pcStackY_1660 = acStackY_1490;
    pcStackY_1640 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_1990,(__timezone_ptr_t)0x0);
    pcStackY_19f8 = (code *)0x113470;
    memleak_start();
    pcStackY_19f8 = (code *)0x113480;
    fdb_get_default_config();
    pcStackY_19f8 = (code *)0x11348d;
    fdb_get_default_kvs_config();
    fStackY_1968.compaction_cb_ctx = &uStackY_19b0;
    uStackY_19b0 = 0;
    uStackY_19a8 = 0;
    uStackY_19a0 = 0;
    fStackY_1968.wal_threshold = 0x400;
    fStackY_1968.flags = 1;
    fStackY_1968.compaction_cb = compaction_cb_markers;
    fStackY_1968.compaction_cb_mask = 0x1b;
    pcStackY_19f8 = (code *)0x1134d3;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_19f8 = (code *)0x1134ea;
    fdb_open(&pfStackY_19e8,"./compact_test1",&fStackY_1968);
    pcStackY_19f8 = (code *)0x113501;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19b8,"db1",&fStackY_1980);
    pcStackY_19f8 = (code *)0x113518;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19c0,"db2",&fStackY_1980);
    pcStackY_19f8 = (code *)0x11352f;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19c8,"db3",&fStackY_1980);
    pcStackY_19f8 = (code *)0x113546;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19d0,"db4",&fStackY_1980);
    pcStackY_19f8 = (code *)0x11355d;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19d8,"db5",&fStackY_1980);
    uVar7 = 0;
    do {
      iVar2 = (int)uVar7;
      if (iVar2 == 5) goto LAB_001136e1;
      uVar7 = 0;
      iStackY_19dc = iVar2;
      do {
        pcStackY_19f8 = (code *)0x11359b;
        sprintf(acStackY_1770,"key%04d",uVar7);
        pcStackY_19f8 = (code *)0x1135aa;
        sprintf(acStackY_1870,"body%04d",uVar7);
        pfVar6 = pfStackY_19b8;
        pcStackY_19f8 = (code *)0x1135b7;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x1135c5;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x1135d9;
        fdb_set_kv(pfVar6,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar6 = pfStackY_19c0;
        pcStackY_19f8 = (code *)0x1135e6;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x1135f1;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x113605;
        fdb_set_kv(pfVar6,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar6 = pfStackY_19c8;
        pcStackY_19f8 = (code *)0x113612;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x11361d;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x113631;
        fdb_set_kv(pfVar6,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar6 = pfStackY_19d0;
        pcStackY_19f8 = (code *)0x11363e;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x113649;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x11365d;
        fdb_set_kv(pfVar6,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar17 = pfStackY_19d8;
        pcStackY_19f8 = (code *)0x11366a;
        pfVar6 = (fdb_kvs_handle *)strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x113675;
        sVar3 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x113693;
        fdb_set_kv(pfVar17,acStackY_1770,(size_t)pfVar6,acStackY_1870,sVar3);
        uVar11 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar11;
      } while (uVar11 != 1000);
      pcStackY_19f8 = (code *)0x1136b0;
      pfVar15 = pfStackY_19e8;
      fVar1 = fdb_commit(pfStackY_19e8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_19f8 = (code *)0x113740;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_00113740;
      }
      uVar7 = (ulong)(iStackY_19dc + 1U);
      uStackY_19b0 = CONCAT44(uStackY_19b0._4_4_,(iStackY_19dc + 1U) * 1000);
      pcStackY_19f8 = (code *)0x1136d4;
      fVar1 = fdb_compact(pfStackY_19e8,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_19f8 = (code *)0x1136e1;
    compact_with_snapshot_open_multi_kvs_test();
LAB_001136e1:
    pcStackY_19f8 = (code *)0x1136eb;
    pfVar15 = pfStackY_19e8;
    fVar1 = fdb_close(pfStackY_19e8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_19f8 = (code *)0x1136f4;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar14 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pcStackY_19f8 = (code *)0x113729;
        iVar2 = fprintf(_stderr,pcVar14,"compact with snapshot_open multi kvs test");
        return iVar2;
      }
    }
    else {
LAB_00113740:
      pcStackY_19f8 = (code *)0x113745;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_19f8 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_1a00 = "body%04d";
    pcStackY_1a20 = "key%04d";
    pcStackY_1a70 = (code *)0x11376f;
    pcStackY_1a18 = acStackY_1870;
    pfStackY_1a10 = pfVar6;
    pcStackY_1a08 = acStackY_1770;
    pcStackY_19f8 = (code *)uVar7;
    gettimeofday(&tStackY_1a30,(__timezone_ptr_t)0x0);
    pcStackY_1a70 = (code *)0x113779;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_19e8->root;
    pcStackY_1a70 = (code *)0x11378c;
    fVar1 = fdb_get_all_snap_markers(pfVar15,(fdb_snapshot_info_t **)&pfStackY_1a68,&uStackY_1a58);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfVar6 = pfStackY_1a68;
      if ((pfStackY_1a68->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x6) {
        pcStackY_1a70 = (code *)0x113870;
        compaction_cb_markers();
        pfVar6 = pfStackY_1a60;
      }
      if (*(fdb_seqnum_t *)((long)(pfVar6->kvs_config).custom_cmp_param + 8) == (long)iVar2) {
        if (uStackY_1a58 != 0) {
          uVar12 = 0;
          uVar7 = uStackY_1a58;
          do {
            if ((&pfVar6->kvs_config)[uVar12].custom_cmp != (fdb_custom_cmp_variable)0x0) {
              lVar19 = 0;
              p_Var20 = (fdb_custom_cmp_variable)0x0;
              do {
                pcVar14 = *(char **)((long)(&pfVar6->kvs_config)[uVar12].custom_cmp_param + lVar19);
                if (pcVar14 != (char *)0x0) {
                  pcStackY_1a70 = (code *)0x1137fa;
                  fdb_kvs_open(pfVar15,&pfStackY_1a60,pcVar14,&fStackY_1a48);
                  pcStackY_1a70 = (code *)0x11380c;
                  fVar1 = fdb_snapshot_open(pfStackY_1a60,&pfStackY_1a50,(long)iVar2);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_1a70 = (code *)0x11381a;
                    fVar1 = fdb_kvs_close(pfStackY_1a50);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_1a70 = (code *)0x11387d;
                      compaction_cb_markers();
                      goto LAB_0011387d;
                    }
                    pcStackY_1a70 = (code *)0x113828;
                    fVar1 = fdb_kvs_close(pfStackY_1a60);
                    pfVar6 = pfStackY_1a68;
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113830;
                  }
                  else {
LAB_0011387d:
                    pcStackY_1a70 = (code *)0x113882;
                    compaction_cb_markers();
                  }
                  pcStackY_1a70 = (code *)0x113887;
                  compaction_cb_markers();
                  goto LAB_00113887;
                }
LAB_00113830:
                p_Var20 = p_Var20 + 1;
                lVar19 = lVar19 + 0x10;
                uVar7 = uStackY_1a58;
              } while (p_Var20 < (&pfVar6->kvs_config)[uVar12].custom_cmp);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar7);
        }
        return 0;
      }
    }
    else {
LAB_00113887:
      pcStackY_1a70 = (code *)0x11388c;
      compaction_cb_markers();
    }
    pcStackY_1a70 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_1b78,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_1b68.compaction_cb = cb_cancel_test;
    fStackY_1b68.compaction_cb_ctx = (void *)0x0;
    fStackY_1b68.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_1b80,"compact_test",&fStackY_1b68);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_1b80,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_1b80);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pbStackY_1260 = (btree *)0x112ba2;
  fVar1 = fdb_kvs_open(pfStack_1230,&pfStack_1228,"db",&fStack_11f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113181;
  pfVar6 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)pfVar6 >> 8),iStack_123c == 0);
  pcStack_1220 = pcVar14 + 0x1a;
  unaff_R13 = (fdb_kvs_handle *)(auStack_10c8 + 0x30);
  pcVar10 = auStack_10c8;
  fconfig = (fdb_config *)0x0;
  do {
    uVar11 = (uint)fconfig;
    pfVar8 = (fdb_config *)(ulong)(uVar11 - 5);
    if (uVar11 < 5) {
      pfVar8 = fconfig;
    }
    pbStackY_1260 = (btree *)0x112bea;
    sprintf((char *)unaff_R13,"key%06d",pfVar8);
    builtin_strncpy(pcVar14,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_1220,"<end>",6);
    pfVar8 = (fdb_config *)(ulong)(uVar11 - 5);
    if (uVar11 < 5) {
      pcVar22 = "value%08d";
      pfVar8 = fconfig;
    }
    else {
      pcVar22 = "updated_value%08d";
    }
    pbStackY_1260 = (btree *)0x112c2e;
    sprintf(pcVar14,pcVar22,pfVar8);
    pfVar17 = pfStack_1228;
    pbStackY_1260 = (btree *)0x112c3b;
    sVar3 = strlen((char *)unaff_R13);
    pbStackY_1260 = (btree *)0x112c53;
    fVar1 = fdb_set_kv(pfVar17,unaff_R13,sVar3 + 1,pcVar14,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113134;
    pfVar8 = fconfig;
    if (iStack_123c == 3) {
LAB_00112c74:
      pfVar6 = (fdb_kvs_handle *)((ulong)pfVar8 & 0xffffffffffffff01);
    }
    else if (iStack_123c == 2) {
      pfVar8 = (fdb_config *)CONCAT71((int7)((ulong)fconfig >> 8),~(byte)fconfig);
      goto LAB_00112c74;
    }
    pbStackY_1260 = (btree *)0x112c86;
    fVar1 = fdb_commit(pfStack_1230,(fdb_commit_opt_t)pfVar6);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113139;
    pbStackY_1260 = (btree *)0x112c9b;
    fVar1 = fdb_get_kvs_info(pfStack_1228,(fdb_kvs_info *)pcVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011313e;
    fconfig = (fdb_config *)(ulong)(uVar11 + 1);
  } while (uVar11 + 1 != 10);
  pbStackY_1260 = (btree *)0x112cc2;
  fVar1 = fdb_get_all_snap_markers(pfStack_1230,&pfStack_1210,(uint64_t *)&iStack_1218);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113186;
  fconfig = (fdb_config *)(CONCAT44(uStack_1214,iStack_1218) >> 1);
  pbStackY_1260 = (btree *)0x112cf3;
  fVar1 = fdb_compact_upto(pfStack_1230,"./compact_test2",pfStack_1210[(int)fconfig].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011318b;
  if (-1 < (int)(iStack_1218 - 1U)) {
    pfVar6 = (fdb_kvs_handle *)(ulong)(iStack_1218 - 1U);
    lStack_11f8 = (long)(int)fconfig;
    fconfig = (fdb_config *)(auStack_10c8 + 0x30);
    do {
      pfVar17 = (fdb_kvs_handle *)(pfStack_1210[(long)pfVar6].kvs_markers)->seqnum;
      pbStackY_1260 = (btree *)0x112d3e;
      fVar1 = fdb_snapshot_open(pfStack_1228,&pfStack_1208,(fdb_seqnum_t)pfVar17);
      if (lStack_11f8 < (long)pfVar6) {
        pfVar18 = pfVar6;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011315e;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113163;
        pbStackY_1260 = (btree *)0x112d7f;
        pfStack_1200 = pfVar6;
        fVar1 = fdb_iterator_init(pfStack_1208,&pfStack_1248,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113168;
        pfVar17 = (fdb_kvs_handle *)((long)&pfVar17[-1].bub_ctx.handle + 3);
        pfVar6 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_1238 = (fdb_kvs_handle *)0x0;
          pbStackY_1260 = (btree *)0x112da6;
          fVar1 = fdb_iterator_get(pfStack_1248,(fdb_doc **)&pfStack_1238);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pbStackY_1260 = (btree *)0x112dc2;
          sprintf((char *)fconfig,"key%06d",(ulong)pfVar6 & 0xffffffff);
          builtin_strncpy(pcVar14,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
          builtin_strncpy(pcStack_1220,"<end>",6);
          pcVar10 = "value%08d";
          if (pfVar6 < pfVar17) {
            pcVar10 = "updated_value%08d";
          }
          pbStackY_1260 = (btree *)0x112e05;
          sprintf(pcVar14,pcVar10,(ulong)pfVar6 & 0xffffffff);
          unaff_R13 = pfStack_1238;
          pcVar10 = (char *)pfStack_1238->op_stats;
          pbStackY_1260 = (btree *)0x112e1d;
          iVar2 = bcmp(pcVar10,fconfig,*(size_t *)&pfStack_1238->kvs_config);
          if (iVar2 != 0) {
            pbStackY_1260 = (btree *)0x113129;
            compact_upto_overwrite_test();
LAB_00113129:
            pbStackY_1260 = (btree *)0x113134;
            compact_upto_overwrite_test();
            goto LAB_00113134;
          }
          pcVar10 = (char *)(unaff_R13->field_6).seqtree;
          pbStackY_1260 = (btree *)0x112e38;
          iVar2 = bcmp(pcVar10,pcVar14,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113129;
          pfVar6 = (fdb_kvs_handle *)&(pfVar6->kvs_config).field_0x1;
          pbStackY_1260 = (btree *)0x112e4b;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pbStackY_1260 = (btree *)0x112e55;
          fVar1 = fdb_iterator_next(pfStack_1248);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pbStackY_1260 = (btree *)0x112e67;
        fVar1 = fdb_iterator_close(pfStack_1248);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
        if ((int)pfVar6 != 5) goto LAB_00113177;
        pbStackY_1260 = (btree *)0x112e83;
        fVar1 = fdb_kvs_close(pfStack_1208);
        pfVar6 = pfStack_1200;
        pfVar18 = pfStack_1200;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113172;
      }
      pfVar6 = (fdb_kvs_handle *)((long)&pfVar18[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar18);
  }
  pbStackY_1260 = (btree *)0x112ec1;
  fVar1 = fdb_iterator_init(pfStack_1228,&pfStack_1248,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113190;
  unaff_R13 = (fdb_kvs_handle *)(auStack_10c8 + 0x30);
  pcVar10 = "updated_value%08d";
  fconfig = (fdb_config *)0x0;
  do {
    pfStack_1238 = (fdb_kvs_handle *)0x0;
    pbStackY_1260 = (btree *)0x112ef2;
    fVar1 = fdb_iterator_get(pfStack_1248,(fdb_doc **)&pfStack_1238);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pbStackY_1260 = (btree *)0x112f0d;
    sprintf((char *)unaff_R13,"key%06d",fconfig);
    builtin_strncpy(pcVar14,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_1220,"<end>",6);
    pbStackY_1260 = (btree *)0x112f3d;
    sprintf(pcVar14,"updated_value%08d",fconfig);
    pfVar17 = pfStack_1238;
    pfVar6 = (fdb_kvs_handle *)pfStack_1238->op_stats;
    pbStackY_1260 = (btree *)0x112f54;
    iVar2 = bcmp(pfVar6,unaff_R13,*(size_t *)&pfStack_1238->kvs_config);
    if (iVar2 != 0) goto LAB_00113143;
    pfVar6 = (fdb_kvs_handle *)(pfVar17->field_6).seqtree;
    pbStackY_1260 = (btree *)0x112f6f;
    iVar2 = bcmp(pfVar6,pcVar14,(size_t)(pfVar17->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_00113153;
    fconfig = (fdb_config *)(ulong)((int)fconfig + 1);
    pbStackY_1260 = (btree *)0x112f81;
    fdb_doc_free((fdb_doc *)pfVar17);
    pbStackY_1260 = (btree *)0x112f8b;
    fVar1 = fdb_iterator_next(pfStack_1248);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pbStackY_1260 = (btree *)0x112f9d;
  fVar1 = fdb_iterator_close(pfStack_1248);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113195;
  if ((int)fconfig != 5) goto LAB_0011319a;
  pbStackY_1260 = (btree *)0x112fbd;
  fVar1 = fdb_free_snap_markers(pfStack_1210,CONCAT44(uStack_1214,iStack_1218));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011319f;
  pbStackY_1260 = (btree *)0x112fcd;
  free(pcVar14);
  pbStackY_1260 = (btree *)0x112fd7;
  fVar1 = fdb_close(pfStack_1230);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a4;
  pbStackY_1260 = (btree *)0x112fe4;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a9;
  pbStackY_1260 = (btree *)0x112ff1;
  memleak_end();
  builtin_strncpy(acStack_11d8 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_11d8,"compact upto ove",0x10);
  switch(iStack_123c) {
  case 0:
    pbStackY_1260 = (btree *)0x11303b;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pbStackY_1260 = (btree *)0x1130bf;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3," (WAL)",7);
    break;
  case 2:
    pbStackY_1260 = (btree *)0x113067;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3 + 0xe,"ie/WAL)",8);
    uVar23._0_1_ = ' ';
    uVar23._1_1_ = 'H';
    uVar23._2_1_ = 'B';
    uVar23._3_1_ = '+';
    uVar24._0_1_ = 't';
    uVar24._1_1_ = 'r';
    uVar24._2_1_ = 'i';
    uVar24._3_1_ = 'e';
    goto LAB_001130a8;
  case 3:
    pbStackY_1260 = (btree *)0x11308f;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3 + 0xe,"B+trie)",8);
    uVar23._0_1_ = ' ';
    uVar23._1_1_ = 'W';
    uVar23._2_1_ = 'A';
    uVar23._3_1_ = 'L';
    uVar24._0_1_ = '/';
    uVar24._1_1_ = 'H';
    uVar24._2_1_ = 'B';
    uVar24._3_1_ = '+';
LAB_001130a8:
    pcVar14 = acStack_11d8 + sVar3;
    pcVar14[0] = ' ';
    pcVar14[1] = '(';
    pcVar14[2] = 'm';
    pcVar14[3] = 'i';
    pcVar14 = acStack_11d8 + sVar3 + 4;
    pcVar14[0] = 'x';
    pcVar14[1] = 'e';
    pcVar14[2] = 'd';
    pcVar14[3] = ',';
    *(undefined4 *)(acStack_11d8 + sVar3 + 8) = uVar23;
    *(undefined4 *)(acStack_11d8 + sVar3 + 0xc) = uVar24;
  }
  pcVar14 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar14 = "%s FAILED\n";
  }
  pbStackY_1260 = (btree *)0x113107;
  iVar2 = fprintf(_stderr,pcVar14,acStack_11d8);
  return iVar2;
}

Assistant:

static fdb_compact_decision cb_upt(fdb_file_handle *fhandle,
                                   fdb_compaction_status status,
                                   const char *kv_name,
                                   fdb_doc *doc, uint64_t old_offset,
                                   uint64_t new_offset,
                                   void *ctx)
{
    TEST_INIT();
    struct cb_upt_args *args = (struct cb_upt_args *)ctx;
    (void) fhandle;
    (void) doc;
    (void) old_offset;
    (void) new_offset;

    if (status == FDB_CS_MOVE_DOC) {
        int i, j;
        int n = 10;
        char keybuf[256], bodybuf[256];
        char keystr[] = "new%04d";
        char valuestr[] = "new_body%04d";
        fdb_status s;
        args->nmoves++;
        if (args->nmoves > n/2 && !args->done) {
            // verify if the key is stripped off its prefix
            fdb_doc tdoc;
            memset(&tdoc, 0, sizeof(fdb_doc));
            tdoc.key = doc->key;
            tdoc.keylen = doc->keylen;
            s = fdb_get(args->handle, &tdoc);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            free(tdoc.meta);
            free(tdoc.body);
            // insert new docs
            for (i=0;i<n/2;++i){
                sprintf(keybuf, keystr, i);
                sprintf(bodybuf, valuestr, i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);

                for (j=0; j<=i; ++j){
                    void *v_out;
                    size_t vlen_out;
                    sprintf(keybuf, keystr, i);
                    sprintf(bodybuf, valuestr, i);
                    s = fdb_get_kv(args->handle2, keybuf, strlen(keybuf)+1,
                        &v_out, &vlen_out);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    fdb_free_block(v_out);
                }
            }
            args->done = 1;
        }
        if (args->nmoves > n && args->done == 1) {
            // the first phase is done. insert new docs.
            for (i=0;i<2;++i){
                sprintf(keybuf, "xxx%d", i);
                sprintf(bodybuf, "xxxvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 2;
        }
        if (args->nmoves == (n*3/2 + 2) && args->done == 2) {
            // during the second-second phase,
            // insert new docs, and do not commit.
            for (i=0;i<2;++i){
                sprintf(keybuf, "zzz%d", i);
                sprintf(bodybuf, "zzzvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 3;
        }
        TEST_CMP(kv_name, "db", 2);
    }

    return 0;
}